

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  ParseInfoTree *this_00;
  ParseInfoTree *info_tree;
  bool bVar1;
  Type TVar2;
  CppType CVar3;
  int iVar4;
  Reflection *this_01;
  Token *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Descriptor *this_02;
  string *psVar6;
  LogMessage *other;
  FieldOptions *pFVar7;
  undefined4 extraout_var_02;
  MessageLite *this_03;
  undefined8 in_RCX;
  AlphaNum *b;
  ParseLocation in_R8;
  ParseLocationRange location;
  bool local_b8b;
  MessageFactory *local_b78;
  byte local_b02;
  ParseInfoTree *local_a80;
  ParseInfoTree *local_a50;
  Descriptor *local_9d8;
  bool local_989;
  ParseLocation local_970;
  ParseLocation local_968;
  ParseLocationRange local_960;
  int local_950;
  int local_94c;
  int end_column;
  int end_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  byte local_903;
  byte local_902;
  allocator local_901;
  string local_900;
  allocator local_8d9;
  string local_8d8;
  allocator local_8b1;
  string local_8b0;
  allocator local_889;
  string local_888;
  allocator local_861;
  string local_860;
  byte local_83b;
  byte local_83a;
  allocator local_839;
  string local_838;
  string local_818;
  allocator local_7f1;
  string local_7f0;
  MessageFactory *local_7d0;
  MessageFactory *factory;
  string tmp;
  allocator local_781;
  string local_780;
  byte local_759;
  undefined1 local_758 [7];
  bool consumed_semicolon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  FieldDescriptor *local_698;
  FieldDescriptor *other_field;
  OneofDescriptor *oneof;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  byte local_643;
  byte local_642;
  allocator local_641;
  string local_640;
  allocator local_619;
  string local_618;
  string local_5f8;
  allocator local_5d1;
  string local_5d0;
  LogFinisher local_5aa;
  byte local_5a9;
  LogMessage local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  string lower_field_name_1;
  string lower_field_name;
  undefined1 local_428 [4];
  int32_t field_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  string local_278;
  allocator local_251;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  Descriptor *local_1f0;
  Descriptor *value_descriptor;
  string serialized_value;
  string local_1c0;
  allocator local_199;
  string local_198;
  AlphaNum local_178;
  AlphaNum local_148;
  undefined1 local_118 [8];
  string prefix_and_full_type_name;
  undefined1 local_f0 [8];
  string prefix;
  string full_type_name;
  string local_a8;
  FieldDescriptor *local_78;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  int start_column;
  int start_line;
  FieldDescriptor *field;
  undefined1 local_50 [7];
  bool reserved_field;
  string field_name;
  Descriptor *descriptor;
  Reflection *reflection;
  Message *message_local;
  ParserImpl *this_local;
  
  this_01 = Message::GetReflection(message);
  field_name.field_2._8_8_ = Message::GetDescriptor(message);
  std::__cxx11::string::string((string *)local_50);
  field._7_1_ = 0;
  _start_column = (ParseInfoTree *)0x0;
  pTVar5 = io::Tokenizer::current(&this->tokenizer_);
  any_type_url_field._4_4_ = pTVar5->line;
  pTVar5 = io::Tokenizer::current(&this->tokenizer_);
  any_type_url_field._0_4_ = pTVar5->column;
  full_type_name.field_2._M_local_buf[0xe] = '\0';
  full_type_name.field_2._M_local_buf[0xd] = '\0';
  bVar1 = internal::GetAnyFieldDescriptors(message,&any_value_field,&local_78);
  b = (AlphaNum *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
  local_989 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    full_type_name.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string
              ((string *)&local_a8,"[",(allocator *)(full_type_name.field_2._M_local_buf + 0xf));
    full_type_name.field_2._M_local_buf[0xd] = '\x01';
    local_989 = TryConsume(this,&local_a8);
  }
  if ((full_type_name.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((full_type_name.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(full_type_name.field_2._M_local_buf + 0xf))
    ;
  }
  if (local_989 != false) {
    std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_f0);
    bVar1 = ConsumeAnyTypeUrl(this,(string *)(prefix.field_2._M_local_buf + 8),(string *)local_f0);
    if (bVar1) {
      strings::AlphaNum::AlphaNum(&local_148,(string *)local_f0);
      strings::AlphaNum::AlphaNum(&local_178,(string *)((long)&prefix.field_2 + 8));
      StrCat_abi_cxx11_((string *)local_118,(protobuf *)&local_148,&local_178,b);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"]",&local_199);
      bVar1 = ConsumeBeforeWhitespace(this,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      if (bVar1) {
        TryConsumeWhitespace(this,(string *)local_118,"Any");
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1c0,":",
                   (allocator *)(serialized_value.field_2._M_local_buf + 0xf));
        TryConsumeBeforeWhitespace(this,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(serialized_value.field_2._M_local_buf + 0xf));
        TryConsumeWhitespace(this,(string *)local_118,"Any");
        std::__cxx11::string::string((string *)&value_descriptor);
        if (this->finder_ == (Finder *)0x0) {
          local_9d8 = anon_unknown_19::DefaultFinderFindAnyType
                                (message,(string *)local_f0,(string *)((long)&prefix.field_2 + 8));
        }
        else {
          iVar4 = (*this->finder_->_vptr_Finder[4])
                            (this->finder_,message,local_f0,
                             (undefined1 *)((long)&prefix.field_2 + 8));
          local_9d8 = (Descriptor *)CONCAT44(extraout_var,iVar4);
        }
        local_1f0 = local_9d8;
        if (local_9d8 == (Descriptor *)0x0) {
          std::operator+(&local_230,"Could not find type \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118);
          std::operator+(&local_210,&local_230,"\" stored in google.protobuf.Any.");
          ReportError(this,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_230);
          this_local._7_1_ = 0;
        }
        else {
          bVar1 = ConsumeAnyValue(this,local_9d8,(string *)&value_descriptor);
          if (bVar1) {
            if ((this->singular_overwrite_policy_ != FORBID_SINGULAR_OVERWRITES) ||
               (((bVar1 = FieldDescriptor::is_repeated(any_value_field), bVar1 ||
                 (bVar1 = Reflection::HasField(this_01,message,any_value_field), !bVar1)) &&
                ((bVar1 = FieldDescriptor::is_repeated(local_78), bVar1 ||
                 (bVar1 = Reflection::HasField(this_01,message,local_78), !bVar1)))))) {
              std::__cxx11::string::string((string *)&local_278,(string *)local_118);
              Reflection::SetString(this_01,message,any_value_field,&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::string((string *)&local_298,(string *)&value_descriptor);
              Reflection::SetString(this_01,message,local_78,&local_298);
              std::__cxx11::string::~string((string *)&local_298);
              this_local._7_1_ = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_250,"Non-repeated Any specified multiple times.",
                         &local_251);
              ReportError(this,&local_250);
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator((allocator<char> *)&local_251);
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        prefix_and_full_type_name.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)&value_descriptor);
      }
      else {
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_118);
    }
    else {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
    goto LAB_00725b36;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"[",&local_2b9);
  bVar1 = TryConsume(this,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  if (bVar1) {
    bVar1 = ConsumeFullTypeName(this,(string *)local_50);
    if (!bVar1) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_00725b36;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,"]",&local_2e1);
    bVar1 = ConsumeBeforeWhitespace(this,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    if (!bVar1) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_00725b36;
    }
    (*(message->super_MessageLite)._vptr_MessageLite[2])(&local_308);
    TryConsumeWhitespace(this,&local_308,"Extension");
    std::__cxx11::string::~string((string *)&local_308);
    if (this->finder_ == (Finder *)0x0) {
      local_a50 = (ParseInfoTree *)
                  anon_unknown_19::DefaultFinderFindExtension(message,(string *)local_50);
    }
    else {
      iVar4 = (*this->finder_->_vptr_Finder[2])(this->finder_,message,local_50);
      local_a50 = (ParseInfoTree *)CONCAT44(extraout_var_00,iVar4);
    }
    _start_column = local_a50;
    if (local_a50 == (ParseInfoTree *)0x0) {
      if (((this->allow_unknown_field_ & 1U) == 0) && ((this->allow_unknown_extension_ & 1U) == 0))
      {
        std::operator+(&local_388,"Extension \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        std::operator+(&local_368,&local_388,"\" is not defined or is not an extension of \"");
        psVar6 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
        std::operator+(&local_348,&local_368,psVar6);
        std::operator+(&local_328,&local_348,"\".");
        ReportError(this,&local_328);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_388);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_00725b36;
      }
      std::operator+(&local_408,"Ignoring extension \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_3e8,&local_408,"\" which is not defined or is not an extension of \"");
      psVar6 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
      std::operator+(&local_3c8,&local_3e8,psVar6);
      std::operator+(&local_3a8,&local_3c8,"\".");
      ReportWarning(this,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
    }
  }
  else {
    bVar1 = ConsumeIdentifierBeforeWhitespace(this,(string *)local_50);
    if (!bVar1) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_00725b36;
    }
    (*(message->super_MessageLite)._vptr_MessageLite[2])(local_428);
    TryConsumeWhitespace(this,(string *)local_428,"Normal");
    std::__cxx11::string::~string((string *)local_428);
    if (((this->allow_field_number_ & 1U) == 0) ||
       (bVar1 = safe_strto32((string *)local_50,
                             (int32 *)(lower_field_name.field_2._M_local_buf + 0xc)), !bVar1)) {
      _start_column =
           (ParseInfoTree *)
           Descriptor::FindFieldByName
                     ((Descriptor *)field_name.field_2._8_8_,(ConstStringParam)local_50);
      if (_start_column == (ParseInfoTree *)0x0) {
        std::__cxx11::string::string
                  ((string *)(lower_field_name_1.field_2._M_local_buf + 8),(string *)local_50);
        LowerString((string *)((long)&lower_field_name_1.field_2 + 8));
        _start_column =
             (ParseInfoTree *)
             Descriptor::FindFieldByName
                       ((Descriptor *)field_name.field_2._8_8_,
                        (ConstStringParam)((long)&lower_field_name_1.field_2 + 8));
        if ((_start_column != (ParseInfoTree *)0x0) &&
           (TVar2 = FieldDescriptor::type((FieldDescriptor *)_start_column), TVar2 != TYPE_GROUP)) {
          _start_column = (ParseInfoTree *)0x0;
        }
        std::__cxx11::string::~string((string *)(lower_field_name_1.field_2._M_local_buf + 8));
      }
      if ((_start_column != (ParseInfoTree *)0x0) &&
         (TVar2 = FieldDescriptor::type((FieldDescriptor *)_start_column), TVar2 == TYPE_GROUP)) {
        this_02 = FieldDescriptor::message_type((FieldDescriptor *)_start_column);
        psVar6 = Descriptor::name_abi_cxx11_(this_02);
        bVar1 = std::operator!=(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_50);
        if (bVar1) {
          _start_column = (ParseInfoTree *)0x0;
        }
      }
      if ((_start_column == (ParseInfoTree *)0x0) &&
         ((this->allow_case_insensitive_field_ & 1U) != 0)) {
        std::__cxx11::string::string((string *)local_470,(string *)local_50);
        LowerString((string *)local_470);
        _start_column =
             (ParseInfoTree *)
             Descriptor::FindFieldByLowercaseName
                       ((Descriptor *)field_name.field_2._8_8_,(ConstStringParam)local_470);
        std::__cxx11::string::~string((string *)local_470);
      }
      if (_start_column == (ParseInfoTree *)0x0) {
        field._7_1_ = Descriptor::IsReservedName
                                ((Descriptor *)field_name.field_2._8_8_,(ConstStringParam)local_50);
      }
    }
    else {
      bVar1 = Descriptor::IsExtensionNumber
                        ((Descriptor *)field_name.field_2._8_8_,lower_field_name.field_2._12_4_);
      if (bVar1) {
        if (this->finder_ == (Finder *)0x0) {
          local_a80 = (ParseInfoTree *)
                      anon_unknown_19::DefaultFinderFindExtensionByNumber
                                ((Descriptor *)field_name.field_2._8_8_,
                                 lower_field_name.field_2._12_4_);
        }
        else {
          iVar4 = (*this->finder_->_vptr_Finder[3])
                            (this->finder_,field_name.field_2._8_8_,
                             (ulong)(uint)lower_field_name.field_2._12_4_);
          local_a80 = (ParseInfoTree *)CONCAT44(extraout_var_01,iVar4);
        }
        _start_column = local_a80;
      }
      else {
        bVar1 = Descriptor::IsReservedNumber
                          ((Descriptor *)field_name.field_2._8_8_,lower_field_name.field_2._12_4_);
        if (bVar1) {
          field._7_1_ = 1;
        }
        else {
          _start_column =
               (ParseInfoTree *)
               Descriptor::FindFieldByNumber
                         ((Descriptor *)field_name.field_2._8_8_,lower_field_name.field_2._12_4_);
        }
      }
    }
    if ((_start_column == (ParseInfoTree *)0x0) && ((field._7_1_ & 1) == 0)) {
      if ((this->allow_unknown_field_ & 1U) == 0) {
        psVar6 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
        std::operator+(&local_4f0,"Message type \"",psVar6);
        std::operator+(&local_4d0,&local_4f0,"\" has no field named \"");
        std::operator+(&local_4b0,&local_4d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        std::operator+(&local_490,&local_4b0,"\".");
        ReportError(this,&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_00725b36;
      }
      psVar6 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
      std::operator+(&local_570,"Message type \"",psVar6);
      std::operator+(&local_550,&local_570,"\" has no field named \"");
      std::operator+(&local_530,&local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_510,&local_530,"\".");
      ReportWarning(this,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_570);
    }
  }
  if (_start_column == (ParseInfoTree *)0x0) {
    local_5a9 = 0;
    if ((((this->allow_unknown_field_ & 1U) == 0) && ((this->allow_unknown_extension_ & 1U) == 0))
       && ((field._7_1_ & 1) == 0)) {
      internal::LogMessage::LogMessage
                (&local_5a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                 ,0x221);
      local_5a9 = 1;
      other = internal::LogMessage::operator<<
                        (&local_5a8,
                         "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                        );
      internal::LogFinisher::operator=(&local_5aa,other);
    }
    if ((local_5a9 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_5a8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d0,":",&local_5d1);
    bVar1 = TryConsumeBeforeWhitespace(this,&local_5d0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    if (bVar1) {
      (*(message->super_MessageLite)._vptr_MessageLite[2])(&local_5f8);
      TryConsumeWhitespace(this,&local_5f8,"Unknown/Reserved");
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::allocator();
      local_642 = 0;
      local_643 = 0;
      std::__cxx11::string::string((string *)&local_618,"{",&local_619);
      bVar1 = LookingAt(this,&local_618);
      local_b02 = 0;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_642 = 1;
        std::__cxx11::string::string((string *)&local_640,"<",&local_641);
        local_643 = 1;
        bVar1 = LookingAt(this,&local_640);
        local_b02 = bVar1 ^ 0xff;
      }
      if ((local_643 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_640);
      }
      if ((local_642 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_641);
      }
      std::__cxx11::string::~string((string *)&local_618);
      std::allocator<char>::~allocator((allocator<char> *)&local_619);
      if ((local_b02 & 1) != 0) {
        this_local._7_1_ = SkipFieldValue(this);
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_00725b36;
      }
    }
    this_local._7_1_ = SkipFieldMessage(this);
    prefix_and_full_type_name.field_2._12_4_ = 1;
    goto LAB_00725b36;
  }
  if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)_start_column);
    if ((!bVar1) &&
       (bVar1 = Reflection::HasField(this_01,message,(FieldDescriptor *)_start_column), bVar1)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oneof,
                     "Non-repeated field \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_668,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oneof,
                     "\" is specified multiple times.");
      ReportError(this,&local_668);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&oneof);
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_00725b36;
    }
    other_field = (FieldDescriptor *)
                  FieldDescriptor::containing_oneof((FieldDescriptor *)_start_column);
    if ((other_field != (FieldDescriptor *)0x0) &&
       (bVar1 = Reflection::HasOneof(this_01,message,(OneofDescriptor *)other_field), bVar1)) {
      local_698 = Reflection::GetOneofFieldDescriptor
                            (this_01,message,(OneofDescriptor *)other_field);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758,
                     "Field \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_738,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758,
                     "\" is specified along with field \"");
      psVar6 = FieldDescriptor::name_abi_cxx11_(local_698);
      std::operator+(&local_718,&local_738,psVar6);
      std::operator+(&local_6f8,&local_718,"\", another member of oneof \"");
      psVar6 = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)other_field);
      std::operator+(&local_6d8,&local_6f8,psVar6);
      std::operator+(&local_6b8,&local_6d8,"\".");
      ReportError(this,&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)local_758);
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_00725b36;
    }
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)_start_column);
  if (CVar3 == CPPTYPE_MESSAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_780,":",&local_781);
    bVar1 = TryConsumeBeforeWhitespace(this,&local_780);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    local_759 = bVar1;
    (*(message->super_MessageLite)._vptr_MessageLite[2])((undefined1 *)((long)&tmp.field_2 + 8));
    TryConsumeWhitespace(this,(string *)((long)&tmp.field_2 + 8),"Normal");
    std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
    if ((local_759 & 1) == 0) goto LAB_00725334;
    pFVar7 = FieldDescriptor::options((FieldDescriptor *)_start_column);
    bVar1 = FieldOptions::weak(pFVar7);
    if ((!bVar1) || (bVar1 = LookingAtType(this,TYPE_STRING), !bVar1)) goto LAB_00725334;
    std::__cxx11::string::string((string *)&factory);
    bVar1 = ConsumeString(this,(string *)&factory);
    if (bVar1) {
      if (this->finder_ == (Finder *)0x0) {
        local_b78 = (MessageFactory *)0x0;
      }
      else {
        iVar4 = (*this->finder_->_vptr_Finder[5])(this->finder_,_start_column);
        local_b78 = (MessageFactory *)CONCAT44(extraout_var_02,iVar4);
      }
      local_7d0 = local_b78;
      this_03 = &Reflection::MutableMessage
                           (this_01,message,(FieldDescriptor *)_start_column,local_b78)->
                 super_MessageLite;
      MessageLite::ParseFromString(this_03,(ConstStringParam)&factory);
      prefix_and_full_type_name.field_2._12_4_ = 2;
    }
    else {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&factory);
    if (prefix_and_full_type_name.field_2._12_4_ != 2) goto LAB_00725b36;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7f0,":",&local_7f1);
    bVar1 = ConsumeBeforeWhitespace(this,&local_7f0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
    if (!bVar1) {
      this_local._7_1_ = 0;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_00725b36;
    }
    (*(message->super_MessageLite)._vptr_MessageLite[2])(&local_818);
    TryConsumeWhitespace(this,&local_818,"Normal");
    std::__cxx11::string::~string((string *)&local_818);
LAB_00725334:
    local_83a = 0;
    local_83b = 0;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)_start_column);
    local_b8b = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_83a = 1;
      std::__cxx11::string::string((string *)&local_838,"[",&local_839);
      local_83b = 1;
      local_b8b = TryConsume(this,&local_838);
    }
    if ((local_83b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_838);
    }
    if ((local_83a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_839);
    }
    if (local_b8b == false) {
      CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)_start_column);
      if (CVar3 == CPPTYPE_MESSAGE) {
        bVar1 = ConsumeFieldMessage(this,message,this_01,(FieldDescriptor *)_start_column);
        if (!bVar1) {
          this_local._7_1_ = 0;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_00725b36;
        }
      }
      else {
        bVar1 = ConsumeFieldValue(this,message,this_01,(FieldDescriptor *)_start_column);
        if (!bVar1) {
          this_local._7_1_ = 0;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_00725b36;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_860,"]",&local_861);
      bVar1 = TryConsume(this,&local_860);
      std::__cxx11::string::~string((string *)&local_860);
      std::allocator<char>::~allocator((allocator<char> *)&local_861);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        do {
          CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)_start_column);
          if (CVar3 == CPPTYPE_MESSAGE) {
            bVar1 = ConsumeFieldMessage(this,message,this_01,(FieldDescriptor *)_start_column);
            if (!bVar1) {
              this_local._7_1_ = 0;
              prefix_and_full_type_name.field_2._12_4_ = 1;
              goto LAB_00725b36;
            }
          }
          else {
            bVar1 = ConsumeFieldValue(this,message,this_01,(FieldDescriptor *)_start_column);
            if (!bVar1) {
              this_local._7_1_ = 0;
              prefix_and_full_type_name.field_2._12_4_ = 1;
              goto LAB_00725b36;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_888,"]",&local_889);
          bVar1 = TryConsume(this,&local_888);
          std::__cxx11::string::~string((string *)&local_888);
          std::allocator<char>::~allocator((allocator<char> *)&local_889);
          if (bVar1) goto LAB_007257e2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_8b0,",",&local_8b1);
          bVar1 = Consume(this,&local_8b0);
          std::__cxx11::string::~string((string *)&local_8b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
        } while (bVar1);
        this_local._7_1_ = 0;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_00725b36;
      }
    }
  }
LAB_007257e2:
  std::allocator<char>::allocator();
  local_902 = 0;
  local_903 = 0;
  std::__cxx11::string::string((string *)&local_8d8,";",&local_8d9);
  bVar1 = TryConsume(this,&local_8d8);
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_902 = 1;
    std::__cxx11::string::string((string *)&local_900,",",&local_901);
    local_903 = 1;
    TryConsume(this,&local_900);
  }
  if ((local_903 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_900);
  }
  if ((local_902 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
  }
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  pFVar7 = FieldDescriptor::options((FieldDescriptor *)_start_column);
  bVar1 = FieldOptions::deprecated(pFVar7);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end_column,
                   "text format contains deprecated field \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(&local_928,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end_column,
                   "\"");
    ReportWarning(this,&local_928);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&end_column);
  }
  if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
    pTVar5 = io::Tokenizer::previous(&this->tokenizer_);
    local_94c = pTVar5->line;
    pTVar5 = io::Tokenizer::previous(&this->tokenizer_);
    info_tree = _start_column;
    local_950 = pTVar5->end_column;
    this_00 = this->parse_info_tree_;
    ParseLocation::ParseLocation
              (&local_968,any_type_url_field._4_4_,(ColumnNumber)any_type_url_field);
    ParseLocation::ParseLocation(&local_970,local_94c,local_950);
    ParseLocationRange::ParseLocationRange(&local_960,local_968,local_970);
    location.end = in_R8;
    location.start = local_960.end;
    RecordLocation((TextFormat *)this_00,info_tree,(FieldDescriptor *)local_960.start,location);
  }
  this_local._7_1_ = 1;
  prefix_and_full_type_name.field_2._12_4_ = 1;
LAB_00725b36:
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      // ':' is optional between message labels and values.
      TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix_and_full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            prefix_and_full_type_name);
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(message->GetTypeName(), "Extension");

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");

      int32_t field_number;
      if (allow_field_number_ && safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace(message->GetTypeName(), "Unknown/Reserved");
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }